

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

void parse_escapes(char *src,mtree_entry *mentry)

{
  byte bVar1;
  char *dest;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  
  pbVar2 = (byte *)src;
  if (((mentry != (mtree_entry *)0x0) && (*src == '.')) && (src[1] == '\0')) {
    mentry->full = '\x01';
  }
  do {
    bVar4 = *pbVar2;
    if (bVar4 == 0) {
      *src = 0;
      return;
    }
    pbVar3 = pbVar2 + 1;
    if (bVar4 == 0x2f && mentry != (mtree_entry *)0x0) {
      mentry->full = '\x01';
      bVar4 = 0x2f;
      goto switchD_00463398_caseD_6f;
    }
    if (bVar4 != 0x5c) goto switchD_00463398_caseD_6f;
    bVar1 = *pbVar3;
    bVar4 = 0x5c;
    switch(bVar1) {
    case 0x6e:
      bVar4 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x75:
      goto switchD_00463398_caseD_6f;
    case 0x72:
      bVar4 = 0xd;
      break;
    case 0x73:
      bVar4 = 0x20;
      break;
    case 0x74:
      bVar4 = 9;
      break;
    case 0x76:
      bVar4 = 0xb;
      break;
    default:
      if (2 < bVar1 - 0x31) {
        if (bVar1 == 0x66) {
          bVar4 = 0xc;
        }
        else if (bVar1 != 0x5c) {
          if (bVar1 == 0x61) {
            bVar4 = 7;
          }
          else if (bVar1 == 0x62) {
            bVar4 = 8;
          }
          else {
            if (bVar1 != 0x30) goto switchD_00463398_caseD_6f;
            if (0xf7 < (byte)(pbVar2[2] - 0x38)) goto LAB_004633a3;
            bVar4 = 0;
          }
        }
        break;
      }
LAB_004633a3:
      if (((pbVar2[2] & 0xf8) == 0x30) && ((pbVar2[3] & 0xf8) == 0x30)) {
        bVar4 = (pbVar2[3] + ((pbVar2[2] & 7) << 3 | bVar1 << 6)) - 0x30;
        pbVar3 = pbVar2 + 4;
      }
      goto switchD_00463398_caseD_6f;
    }
    pbVar3 = pbVar2 + 2;
switchD_00463398_caseD_6f:
    *src = bVar4;
    src = (char *)((byte *)src + 1);
    pbVar2 = pbVar3;
  } while( true );
}

Assistant:

static void
parse_escapes(char *src, struct mtree_entry *mentry)
{
	char *dest = src;
	char c;

	if (mentry != NULL && strcmp(src, ".") == 0)
		mentry->full = 1;

	while (*src != '\0') {
		c = *src++;
		if (c == '/' && mentry != NULL)
			mentry->full = 1;
		if (c == '\\') {
			switch (src[0]) {
			case '0':
				if (src[1] < '0' || src[1] > '7') {
					c = 0;
					++src;
					break;
				}
				/* FALLTHROUGH */
			case '1':
			case '2':
			case '3':
				if (src[1] >= '0' && src[1] <= '7' &&
				    src[2] >= '0' && src[2] <= '7') {
					c = (src[0] - '0') << 6;
					c |= (src[1] - '0') << 3;
					c |= (src[2] - '0');
					src += 3;
				}
				break;
			case 'a':
				c = '\a';
				++src;
				break;
			case 'b':
				c = '\b';
				++src;
				break;
			case 'f':
				c = '\f';
				++src;
				break;
			case 'n':
				c = '\n';
				++src;
				break;
			case 'r':
				c = '\r';
				++src;
				break;
			case 's':
				c = ' ';
				++src;
				break;
			case 't':
				c = '\t';
				++src;
				break;
			case 'v':
				c = '\v';
				++src;
				break;
			case '\\':
				c = '\\';
				++src;
				break;
			}
		}
		*dest++ = c;
	}
	*dest = '\0';
}